

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O2

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,size_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Xword EVar1;
  Elf64_Addr EVar2;
  Elf64_Off EVar3;
  Elf64_Xword EVar4;
  Elf64_Xword EVar5;
  Elf64_Xword EVar6;
  Elf64_Word EVar7;
  Elf64_Word EVar8;
  Elf64_Word EVar9;
  Elf64_Word *pEVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  size_t count;
  Elf64_Word *pEVar14;
  ulong uVar15;
  undefined6 in_register_00000032;
  undefined1 auStack_448 [4];
  Elf64_Word EStack_444;
  Elf64_Shdr buf [16];
  
  uVar15 = CONCAT62(in_register_00000032,sh_num) & 0xffffffff;
  uVar12 = 0;
  while( true ) {
    lVar13 = uVar15 - uVar12;
    if (uVar15 < uVar12 || lVar13 == 0) {
      return false;
    }
    count = lVar13 * 0x40;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar11 = ReadFromOffset(fd,auStack_448,count,uVar12 * 0x40 + sh_offset);
    if (uVar11 == 0xffffffffffffffff) break;
    if (((uVar11 & 0x3f) != 0) || (0x43f < uVar11)) {
      abort();
    }
    lVar13 = (uVar11 >> 6) + 1;
    pEVar10 = &EStack_444;
    while (pEVar14 = pEVar10, lVar13 = lVar13 + -1, lVar13 != 0) {
      pEVar10 = pEVar14 + 0x10;
      if (*pEVar14 == type) {
        EVar7 = pEVar14[0];
        EVar1 = *(Elf64_Xword *)(pEVar14 + 1);
        EVar2 = *(Elf64_Addr *)(pEVar14 + 3);
        EVar3 = *(Elf64_Off *)(pEVar14 + 5);
        EVar4 = *(Elf64_Xword *)(pEVar14 + 7);
        EVar8 = pEVar14[9];
        EVar9 = pEVar14[10];
        EVar5 = *(Elf64_Xword *)(pEVar14 + 0xb);
        EVar6 = *(Elf64_Xword *)(pEVar14 + 0xd);
        out->sh_name = pEVar14[-1];
        out->sh_type = EVar7;
        out->sh_flags = EVar1;
        out->sh_addr = EVar2;
        out->sh_offset = EVar3;
        out->sh_size = EVar4;
        out->sh_link = EVar8;
        out->sh_info = EVar9;
        out->sh_addralign = EVar5;
        out->sh_entsize = EVar6;
        return true;
      }
    }
    uVar12 = uVar12 + (uVar11 >> 6);
  }
  return false;
}

Assistant:

static ATTRIBUTE_NOINLINE bool
GetSectionHeaderByType(const int fd, ElfW(Half) sh_num, const size_t sh_offset,
                       ElfW(Word) type, ElfW(Shdr) *out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (size_t i = 0; i < sh_num;) {
    const size_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const size_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_headers_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (size_t j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}